

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::DoWhileStatement(SQCompiler *this)

{
  undefined4 uVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQFuncState *funcstate;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  SQInteger SVar6;
  SQUnsignedInteger SVar7;
  SQUnsignedInteger SVar8;
  SQFuncState *in_RDI;
  SQObject SVar9;
  SQInteger unaff_retaddr;
  SQCompiler *in_stack_00000008;
  SQInteger continuetrg;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQInteger jmptrg;
  longlong *in_stack_ffffffffffffff58;
  SQCompiler *in_stack_ffffffffffffff60;
  SQLocalVarInfo *ntoresolve;
  SQInteger in_stack_ffffffffffffff68;
  SQFuncState *in_stack_ffffffffffffff70;
  SQCompiler *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  SQOpcode SVar10;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SQFuncState *in_stack_ffffffffffffffb0;
  
  SVar10 = (SQOpcode)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  Lex(in_stack_ffffffffffffff60);
  funcstate = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x127c4f);
  SVar4 = sqvector<long_long>::size((sqvector<long_long> *)&(in_RDI->_vlocals)._vals[1]._pos);
  SVar5 = sqvector<long_long>::size((sqvector<long_long> *)&(in_RDI->_vlocals)._vals[2]._start_op);
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SVar7 = (in_RDI->_localvarinfos)._allocated;
  SVar2 = (in_RDI->_literals).super_SQObject._type;
  uVar1 = *(undefined4 *)&(in_RDI->_literals).super_SQObject.field_0x4;
  (in_RDI->_localvarinfos)._allocated = (in_RDI->_vlocals)._vals[0xb]._start_op;
  SVar6 = SQFuncState::GetStackSize((SQFuncState *)0x127d18);
  *(SQInteger *)&(in_RDI->_literals).super_SQObject = SVar6;
  Statement((SQCompiler *)__oldscope__.stacksize,__oldscope__.outers._7_1_);
  SVar8 = (in_RDI->_vlocals)._vals[0xb]._start_op;
  SVar6 = SQFuncState::GetStackSize((SQFuncState *)0x127d4c);
  if ((SVar6 != *(long *)&(in_RDI->_literals).super_SQObject) &&
     (SQFuncState::SetStackSize
                (in_stack_ffffffffffffffb0,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
     SVar8 != (in_RDI->_vlocals)._vals[0xb]._start_op)) {
    SQFuncState::AddInstruction
              ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),SVar10,
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(SQInteger)in_RDI,
               (SQInteger)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  (in_RDI->_localvarinfos)._allocated = SVar7;
  (in_RDI->_literals).super_SQObject._type = SVar2;
  *(undefined4 *)&(in_RDI->_literals).super_SQObject.field_0x4 = uVar1;
  Expect(in_stack_00000008,unaff_retaddr);
  SQFuncState::GetCurrentPos((SQFuncState *)0x127ded);
  SVar9 = Expect(in_stack_00000008,unaff_retaddr);
  SVar2 = SVar9._type;
  CommaExpr(in_stack_ffffffffffffff60);
  SVar9 = Expect(in_stack_00000008,unaff_retaddr);
  SVar10 = SVar9._unVal._4_4_;
  SVar3 = SVar9._type;
  ntoresolve = (in_RDI->_vlocals)._vals;
  SQFuncState::PopTarget(in_stack_ffffffffffffff70);
  SQFuncState::AddInstruction
            ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff94,SVar2),SVar10,
             CONCAT44(in_stack_ffffffffffffff84,SVar3),(SQInteger)in_RDI,
             (SQInteger)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = (SQCompiler *)(in_RDI->_vlocals)._vals;
  SQFuncState::GetCurrentPos((SQFuncState *)0x127e88);
  SQFuncState::AddInstruction
            ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff94,SVar2),SVar10,
             CONCAT44(in_stack_ffffffffffffff84,SVar3),(SQInteger)in_RDI,(SQInteger)this_00,
             (SQInteger)funcstate);
  SVar7 = sqvector<long_long>::size((sqvector<long_long> *)&(in_RDI->_vlocals)._vals[1]._pos);
  SVar8 = sqvector<long_long>::size((sqvector<long_long> *)&(in_RDI->_vlocals)._vals[2]._start_op);
  if (0 < (long)(SVar8 - SVar5)) {
    ResolveContinues(this_00,funcstate,(SQInteger)ntoresolve,(SQInteger)in_stack_ffffffffffffff58);
  }
  if (0 < (long)(SVar7 - SVar4)) {
    ResolveBreaks((SQCompiler *)CONCAT44(in_stack_ffffffffffffff84,SVar3),in_RDI,(SQInteger)this_00)
    ;
  }
  sqvector<long_long>::pop_back
            ((sqvector<long_long> *)&(in_RDI->_vlocals)._vals[9]._name.super_SQObject._unVal);
  sqvector<long_long>::pop_back((sqvector<long_long> *)&(in_RDI->_vlocals)._vals[9]._pos);
  return;
}

Assistant:

void DoWhileStatement()
    {
        Lex();
        SQInteger jmptrg = _fs->GetCurrentPos();
        BEGIN_BREAKBLE_BLOCK()
        BEGIN_SCOPE();
        Statement();
        END_SCOPE();
        Expect(TK_WHILE);
        SQInteger continuetrg = _fs->GetCurrentPos();
        Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget(), 1);
        _fs->AddInstruction(_OP_JMP, 0, jmptrg - _fs->GetCurrentPos() - 1);
        END_BREAKBLE_BLOCK(continuetrg);
    }